

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O2

void __thiscall cs::token_vargs::~token_vargs(token_vargs *this)

{
  void *in_RSI;
  
  std::__cxx11::string::~string((string *)&this->mId);
  token_base::operator_delete(&this->super_token_base,in_RSI);
  return;
}

Assistant:

token_vargs() = delete;